

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

void NULLCTypeInfo::SetFunctionContext(NULLCRef obj,NULLCRef context)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 in_RAX;
  char *pcVar6;
  long lVar7;
  long lVar8;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x17b,"void NULLCTypeInfo::SetFunctionContext(NULLCRef, NULLCRef)");
  }
  uVar2 = *(uint *)(linker + 0x20c);
  if (uVar2 <= in_stack_00000008) goto LAB_00239104;
  lVar7 = *(long *)(linker + 0x200);
  if (*(int *)(lVar7 + 0x10 + (ulong)in_stack_00000008 * 0x50) == 3) {
    uVar3 = *(uint *)((undefined8 *)CONCAT44(obj.typeID,in_stack_0000000c) + 1);
    if (*(uint *)(linker + 0x24c) <= uVar3) {
      pcVar6 = 
      "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_00239166;
    }
    lVar8 = (ulong)uVar3 * 0x94;
    puVar1 = (uint *)(*(long *)(linker + 0x240) + lVar8);
    uVar3 = *(uint *)(*(long *)(linker + 0x240) + 0x4c + lVar8);
    if ((ulong)uVar3 != 0xffffffff) {
      if (uVar3 < uVar2) {
        lVar8 = (ulong)uVar3 * 0x50;
        if (*(uint *)(lVar7 + 0x24 + lVar8) == obj.ptr._4_4_) {
          *(undefined8 *)CONCAT44(obj.typeID,in_stack_0000000c) =
               CONCAT44(context.typeID,in_stack_0000001c);
          return;
        }
        if (obj.ptr._4_4_ < uVar2) {
          uVar2 = *(uint *)(lVar7 + (ulong)obj.ptr._4_4_ * 0x50);
          uVar3 = *(uint *)(linker + 0x29c);
          if (((uVar2 < uVar3) && (uVar4 = *puVar1, uVar4 < uVar3)) &&
             (uVar5 = *(uint *)(lVar7 + lVar8), uVar5 < uVar3)) {
            lVar7 = *(long *)(linker + 0x290);
            nullcThrowError("functionSetContext: cannot set context of type \'%s\' to the function \'%s\' expecting context of type \'%s\'"
                            ,(ulong)uVar2 + lVar7,(ulong)uVar4 + lVar7,(ulong)uVar5 + lVar7,in_RAX);
            return;
          }
          goto LAB_0023911b;
        }
      }
LAB_00239104:
      pcVar6 = 
      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_00239166;
    }
    uVar3 = *puVar1;
    if (uVar3 < *(uint *)(linker + 0x29c)) {
      lVar7 = (ulong)uVar3 + *(long *)(linker + 0x290);
      pcVar6 = "functionSetContext: function \'%s\' doesn\'t have a context";
      goto LAB_002390af;
    }
  }
  else {
    uVar3 = *(uint *)(lVar7 + (ulong)in_stack_00000008 * 0x50);
    if (uVar3 < *(uint *)(linker + 0x29c)) {
      lVar7 = (ulong)uVar3 + *(long *)(linker + 0x290);
      pcVar6 = "functionSetContext: received type \'%s\' that is not a function";
LAB_002390af:
      nullcThrowError(pcVar6,lVar7,(ulong)uVar2,in_RAX);
      return;
    }
  }
LAB_0023911b:
  pcVar6 = 
  "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00239166:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,pcVar6);
}

Assistant:

void SetFunctionContext(NULLCRef obj, NULLCRef context)
	{
		assert(linker);

		ExternTypeInfo &objectType = linker->exTypes[obj.typeID];

		if(objectType.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionSetContext: received type '%s' that is not a function", &linker->exSymbols[objectType.offsetToName]);
			return;
		}

		NULLCFuncPtr *ptr = (NULLCFuncPtr*)obj.ptr;

		ExternFuncInfo &function = linker->exFunctions[ptr->id];

		if(function.contextType == ~0u)
		{
			nullcThrowError("functionSetContext: function '%s' doesn't have a context", &linker->exSymbols[function.offsetToName]);
			return;
		}

		ExternTypeInfo &contextRefType = linker->exTypes[function.contextType];

		if(contextRefType.subType != context.typeID)
		{
			nullcThrowError("functionSetContext: cannot set context of type '%s' to the function '%s' expecting context of type '%s'", &linker->exSymbols[linker->exTypes[context.typeID].offsetToName], &linker->exSymbols[function.offsetToName], &linker->exSymbols[linker->exTypes[function.contextType].offsetToName]);
			return;
		}

		ptr->context = context.ptr;
	}